

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_curse_expr(parser *p)

{
  int16_t iVar1;
  int iVar2;
  void *pvVar3;
  char *name_00;
  char *name_01;
  char *string;
  expression_t *expression_00;
  expression_base_value_f function_00;
  parser_error local_54;
  parser_error result;
  char *expr;
  char *base;
  char *name;
  effect *effect;
  expression_base_value_f function;
  expression_t *expression;
  curse *curse;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = *(char **)(*(long *)((long)pvVar3 + 0x18) + 0x100);
    if (name == (char *)0x0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      for (; *(long *)name != 0; name = *(char **)name) {
      }
      if (*(long *)(name + 0x10) == 0) {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        name_00 = parser_getsym(p,"name");
        name_01 = parser_getsym(p,"base");
        string = parser_getstr(p,"expr");
        expression_00 = expression_new();
        if (expression_00 == (expression_t *)0x0) {
          p_local._4_4_ = PARSE_ERROR_INVALID_EXPRESSION;
        }
        else {
          function_00 = effect_value_base_by_name(name_01);
          expression_set_base_value(expression_00,function_00);
          iVar1 = expression_add_operations_string(expression_00,string);
          if (iVar1 < 0) {
            local_54 = PARSE_ERROR_BAD_EXPRESSION_STRING;
          }
          else {
            iVar2 = dice_bind_expression(*(dice_t **)(name + 0x10),name_00,expression_00);
            if (iVar2 < 0) {
              local_54 = PARSE_ERROR_UNBOUND_EXPRESSION;
            }
            else {
              local_54 = PARSE_ERROR_NONE;
            }
          }
          expression_free(expression_00);
          p_local._4_4_ = local_54;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_curse_expr(struct parser *p) {
	struct curse *curse = parser_priv(p);
	expression_t *expression;
	expression_base_value_f function;
	struct effect *effect;
	const char *name;
	const char *base;
	const char *expr;
	enum parser_error result;

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = curse->obj->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	/* Go to the correct effect */
	while (effect->next) effect = effect->next;
	/* If there are no dice, assume that this is human and not parser error. */
	if (effect->dice == NULL) {
		return PARSE_ERROR_NONE;
	}

	name = parser_getsym(p, "name");
	base = parser_getsym(p, "base");
	expr = parser_getstr(p, "expr");
	expression = expression_new();
	if (expression == NULL) {
		return PARSE_ERROR_INVALID_EXPRESSION;
	}
	function = effect_value_base_by_name(base);
	expression_set_base_value(expression, function);
	if (expression_add_operations_string(expression, expr) < 0) {
		result = PARSE_ERROR_BAD_EXPRESSION_STRING;
	} else if (dice_bind_expression(effect->dice, name, expression) < 0) {
		result = PARSE_ERROR_UNBOUND_EXPRESSION;
	} else {
		result = PARSE_ERROR_NONE;
	}
	/* The dice object makes a deep copy of the expression, so we can free it */
	expression_free(expression);
	return result;
}